

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall>::fulfill
          (AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall> *this,
          Promise<void> *value)

{
  Promise<void> *value_00;
  ExceptionOr<kj::Promise<void>_> local_1c0;
  Promise<void> *local_18;
  Promise<void> *value_local;
  AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (Promise<void> *)this;
    value_00 = mv<kj::Promise<void>>(value);
    ExceptionOr<kj::Promise<void>_>::ExceptionOr(&local_1c0,value_00);
    ExceptionOr<kj::Promise<void>_>::operator=(&this->result,&local_1c0);
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_1c0);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }